

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O1

void duckdb::RowOperations::Gather
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,idx_t build_size,data_ptr_t heap_ptr)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  PhysicalType PVar4;
  idx_t iVar5;
  sel_t *psVar6;
  data_ptr_t pdVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  value_type vVar10;
  byte bVar11;
  undefined8 uVar12;
  uint uVar13;
  data_ptr_t *ppdVar14;
  data_ptr_t *validitymask_locations;
  const_reference pvVar15;
  ulong uVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  InternalException *this;
  data_ptr_t pdVar18;
  SelectionVector *pSVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  SelectionVector *pSVar23;
  data_ptr_t pdVar24;
  ulong uVar25;
  byte bVar26;
  ulong local_a0;
  ulong local_98;
  SelectionVector *local_90;
  SelectionVector *local_88;
  buffer_ptr<ValidityBuffer> *local_80;
  ulong local_78;
  data_ptr_t local_70;
  NestedValidity local_68;
  idx_t local_38;
  
  local_98 = count;
  local_90 = row_sel;
  local_88 = col_sel;
  Vector::SetVectorType(col,FLAT_VECTOR);
  uVar21 = local_98;
  PVar4 = (col->type).physical_type_;
  bVar26 = (byte)col_no;
  if (PVar4 < VARCHAR) {
    switch(PVar4) {
    case BOOL:
    case INT8:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          pdVar7[uVar20] = *(data_t *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case UINT8:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          pdVar7[uVar20] = *(data_t *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case UINT16:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined2 *)(pdVar7 + uVar20 * 2) = *(undefined2 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case INT16:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined2 *)(pdVar7 + uVar20 * 2) = *(undefined2 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case UINT32:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined4 *)(pdVar7 + uVar20 * 4) = *(undefined4 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case INT32:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined4 *)(pdVar7 + uVar20 * 4) = *(undefined4 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case UINT64:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined8 *)(pdVar7 + uVar20 * 8) = *(undefined8 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case INT64:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined8 *)(pdVar7 + uVar20 * 8) = *(undefined8 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    default:
switchD_012a91d3_caseD_a:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_68.list_validity_location = (data_ptr_t)&local_68.entry_idx;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Unimplemented type for RowOperations::Gather","");
      InternalException::InternalException(this,(string *)&local_68);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined4 *)(pdVar7 + uVar20 * 4) = *(undefined4 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case DOUBLE:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          *(undefined8 *)(pdVar7 + uVar20 * 8) = *(undefined8 *)(lVar8 + (long)pdVar24);
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case INTERVAL:
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      pdVar24 = (data_ptr_t)*pvVar15;
      pdVar18 = rows->data;
      pdVar7 = col->data;
      FlatVector::VerifyFlatVector(col);
      if (local_98 != 0) {
        uVar25 = col_no >> 3;
        local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar22 = 0;
        pSVar19 = local_88;
        uVar21 = local_98;
        pSVar23 = local_90;
        local_78 = uVar25;
        local_70 = pdVar24;
        do {
          uVar16 = uVar22;
          if (pSVar23->sel_vector != (sel_t *)0x0) {
            uVar16 = (ulong)pSVar23->sel_vector[uVar22];
          }
          uVar20 = uVar22;
          if (pSVar19->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)pSVar19->sel_vector[uVar22];
          }
          lVar8 = *(long *)(pdVar18 + uVar16 * 8);
          uVar12 = ((undefined8 *)(lVar8 + (long)pdVar24))[1];
          *(undefined8 *)(pdVar7 + uVar20 * 0x10) = *(undefined8 *)(lVar8 + (long)pdVar24);
          *(undefined8 *)(pdVar7 + uVar20 * 0x10 + 8) = uVar12;
          if (lVar8 == 0) {
            uVar13 = 0xff;
          }
          else {
            uVar13 = (uint)*(byte *)(lVar8 + uVar25);
          }
          if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
            if ((0x800 < build_size) &&
               ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0)) {
              local_a0 = build_size;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_a0);
              ppdVar14 = local_68.struct_validity_locations;
              pdVar24 = local_68.list_validity_location;
              local_68.list_validity_location = (data_ptr_t)0x0;
              local_68.struct_validity_locations = (data_ptr_t *)0x0;
              p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pdVar24;
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_68.struct_validity_locations);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_80);
              (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
              pSVar19 = local_88;
              uVar21 = local_98;
              pSVar23 = local_90;
              pdVar24 = local_70;
              uVar25 = local_78;
            }
            bVar11 = (byte)uVar20 & 0x3f;
            puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar20 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      break;
    case LIST:
    case STRUCT:
    case ARRAY:
      local_a0 = local_98;
      pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
      vVar10 = *pvVar15;
      iVar5 = layout->heap_pointer_offset;
      pdVar24 = rows->data;
      uVar21 = -(ulong)(uVar21 >> 0x3d != 0) | uVar21 * 8;
      ppdVar14 = (data_ptr_t *)operator_new__(uVar21);
      validitymask_locations = (data_ptr_t *)operator_new__(uVar21);
      if (local_98 != 0) {
        psVar6 = local_90->sel_vector;
        uVar21 = 0;
        do {
          uVar25 = uVar21;
          if (psVar6 != (sel_t *)0x0) {
            uVar25 = (ulong)psVar6[uVar21];
          }
          pdVar18 = *(data_ptr_t *)(pdVar24 + uVar25 * 8);
          validitymask_locations[uVar21] = pdVar18;
          lVar8 = *(long *)(pdVar24 + uVar25 * 8);
          if (heap_ptr == (data_ptr_t)0x0) {
            pdVar18 = *(data_ptr_t *)(lVar8 + vVar10);
          }
          else {
            pdVar18 = heap_ptr + *(long *)(lVar8 + vVar10) + *(long *)(pdVar18 + iVar5);
          }
          ppdVar14[uVar21] = pdVar18;
          uVar21 = uVar21 + 1;
        } while (local_98 != uVar21);
      }
      NestedValidity::NestedValidity(&local_68,validitymask_locations,col_no);
      HeapGather(col,&local_a0,local_88,ppdVar14,&local_68);
      operator_delete__(validitymask_locations);
      operator_delete__(ppdVar14);
    }
  }
  else if (PVar4 == VARCHAR) {
    pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
    vVar10 = *pvVar15;
    local_38 = layout->heap_pointer_offset;
    pdVar24 = rows->data;
    pdVar18 = col->data;
    FlatVector::VerifyFlatVector(col);
    if (local_98 != 0) {
      uVar25 = col_no >> 3;
      local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar22 = 0;
      pSVar19 = local_88;
      uVar21 = local_98;
      pSVar23 = local_90;
      local_78 = uVar25;
      local_70 = pdVar24;
      do {
        uVar16 = uVar22;
        if (pSVar23->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)pSVar23->sel_vector[uVar22];
        }
        uVar20 = uVar22;
        if (pSVar19->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)pSVar19->sel_vector[uVar22];
        }
        lVar8 = *(long *)(pdVar24 + uVar16 * 8);
        puVar3 = (undefined8 *)(lVar8 + vVar10);
        uVar12 = puVar3[1];
        pdVar7 = pdVar18 + uVar20 * 0x10;
        *(undefined8 *)pdVar7 = *puVar3;
        *(undefined8 *)(pdVar7 + 8) = uVar12;
        if (lVar8 == 0) {
          uVar13 = 0xff;
        }
        else {
          uVar13 = (uint)*(byte *)(lVar8 + uVar25);
        }
        if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
          if ((0x800 < build_size) &&
             ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0)) {
            local_a0 = build_size;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar14 = local_68.struct_validity_locations;
            pdVar24 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar24;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            pSVar19 = local_88;
            uVar21 = local_98;
            pSVar23 = local_90;
            pdVar24 = local_70;
            uVar25 = local_78;
          }
          if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar14 = local_68.struct_validity_locations;
            pdVar24 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar24;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            pSVar19 = local_88;
            uVar21 = local_98;
            pSVar23 = local_90;
            pdVar24 = local_70;
            uVar25 = local_78;
          }
          bVar11 = (byte)uVar20 & 0x3f;
          puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar20 >> 6);
          *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        else if ((heap_ptr != (data_ptr_t)0x0) && (0xc < *(uint *)(lVar8 + vVar10))) {
          plVar1 = (long *)(pdVar18 + uVar20 * 0x10 + 8);
          *plVar1 = (long)(heap_ptr + *plVar1 + *(long *)(lVar8 + local_38));
        }
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
  }
  else if (PVar4 == UINT128) {
    pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
    pdVar24 = (data_ptr_t)*pvVar15;
    pdVar18 = rows->data;
    pdVar7 = col->data;
    FlatVector::VerifyFlatVector(col);
    if (local_98 != 0) {
      uVar25 = col_no >> 3;
      local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar22 = 0;
      pSVar19 = local_88;
      uVar21 = local_98;
      pSVar23 = local_90;
      local_78 = uVar25;
      local_70 = pdVar24;
      do {
        uVar16 = uVar22;
        if (pSVar23->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)pSVar23->sel_vector[uVar22];
        }
        uVar20 = uVar22;
        if (pSVar19->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)pSVar19->sel_vector[uVar22];
        }
        lVar8 = *(long *)(pdVar18 + uVar16 * 8);
        uVar12 = ((undefined8 *)(lVar8 + (long)pdVar24))[1];
        *(undefined8 *)(pdVar7 + uVar20 * 0x10) = *(undefined8 *)(lVar8 + (long)pdVar24);
        *(undefined8 *)(pdVar7 + uVar20 * 0x10 + 8) = uVar12;
        if (lVar8 == 0) {
          uVar13 = 0xff;
        }
        else {
          uVar13 = (uint)*(byte *)(lVar8 + uVar25);
        }
        if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
          if ((0x800 < build_size) &&
             ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0)) {
            local_a0 = build_size;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar14 = local_68.struct_validity_locations;
            pdVar24 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar24;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            pSVar19 = local_88;
            uVar21 = local_98;
            pSVar23 = local_90;
            pdVar24 = local_70;
            uVar25 = local_78;
          }
          if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar14 = local_68.struct_validity_locations;
            pdVar24 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar24;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            pSVar19 = local_88;
            uVar21 = local_98;
            pSVar23 = local_90;
            pdVar24 = local_70;
            uVar25 = local_78;
          }
          bVar11 = (byte)uVar20 & 0x3f;
          puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar20 >> 6);
          *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
  }
  else {
    if (PVar4 != INT128) goto switchD_012a91d3_caseD_a;
    pvVar15 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_no);
    pdVar24 = (data_ptr_t)*pvVar15;
    pdVar18 = rows->data;
    pdVar7 = col->data;
    FlatVector::VerifyFlatVector(col);
    if (local_98 != 0) {
      uVar25 = col_no >> 3;
      local_80 = &(col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar22 = 0;
      pSVar19 = local_88;
      uVar21 = local_98;
      pSVar23 = local_90;
      local_78 = uVar25;
      local_70 = pdVar24;
      do {
        uVar16 = uVar22;
        if (pSVar23->sel_vector != (sel_t *)0x0) {
          uVar16 = (ulong)pSVar23->sel_vector[uVar22];
        }
        uVar20 = uVar22;
        if (pSVar19->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)pSVar19->sel_vector[uVar22];
        }
        lVar8 = *(long *)(pdVar18 + uVar16 * 8);
        uVar12 = ((undefined8 *)(lVar8 + (long)pdVar24))[1];
        *(undefined8 *)(pdVar7 + uVar20 * 0x10) = *(undefined8 *)(lVar8 + (long)pdVar24);
        *(undefined8 *)(pdVar7 + uVar20 * 0x10 + 8) = uVar12;
        if (lVar8 == 0) {
          uVar13 = 0xff;
        }
        else {
          uVar13 = (uint)*(byte *)(lVar8 + uVar25);
        }
        if ((uVar13 & 1 << (bVar26 & 7)) == 0) {
          if ((0x800 < build_size) &&
             ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0)) {
            local_a0 = build_size;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity = build_size;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar14 = local_68.struct_validity_locations;
            pdVar24 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar24;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            pSVar19 = local_88;
            uVar21 = local_98;
            pSVar23 = local_90;
            pdVar24 = local_70;
            uVar25 = local_78;
          }
          if ((col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_a0 = (col->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_a0);
            ppdVar14 = local_68.struct_validity_locations;
            pdVar24 = local_68.list_validity_location;
            local_68.list_validity_location = (data_ptr_t)0x0;
            local_68.struct_validity_locations = (data_ptr_t *)0x0;
            p_Var9 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pdVar24;
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppdVar14;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.struct_validity_locations
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_68.struct_validity_locations);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_80);
            (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            pSVar19 = local_88;
            uVar21 = local_98;
            pSVar23 = local_90;
            pdVar24 = local_70;
            uVar25 = local_78;
          }
          bVar11 = (byte)uVar20 & 0x3f;
          puVar2 = (col->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar20 >> 6);
          *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
  }
  return;
}

Assistant:

void RowOperations::Gather(Vector &rows, const SelectionVector &row_sel, Vector &col, const SelectionVector &col_sel,
                           const idx_t count, const RowLayout &layout, const idx_t col_no, const idx_t build_size,
                           data_ptr_t heap_ptr) {
	D_ASSERT(rows.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rows.GetType().id() == LogicalTypeId::POINTER); // "Cannot gather from non-pointer type!"

	col.SetVectorType(VectorType::FLAT_VECTOR);
	switch (col.GetType().InternalType()) {
	case PhysicalType::UINT8:
		TemplatedGatherLoop<uint8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT16:
		TemplatedGatherLoop<uint16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT32:
		TemplatedGatherLoop<uint32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT64:
		TemplatedGatherLoop<uint64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT128:
		TemplatedGatherLoop<uhugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedGatherLoop<int8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT16:
		TemplatedGatherLoop<int16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT32:
		TemplatedGatherLoop<int32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT64:
		TemplatedGatherLoop<int64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT128:
		TemplatedGatherLoop<hugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::FLOAT:
		TemplatedGatherLoop<float>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGatherLoop<double>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INTERVAL:
		TemplatedGatherLoop<interval_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::VARCHAR:
		GatherVarchar(rows, row_sel, col, col_sel, count, layout, col_no, build_size, heap_ptr);
		break;
	case PhysicalType::LIST:
	case PhysicalType::STRUCT:
	case PhysicalType::ARRAY:
		GatherNestedVector(rows, row_sel, col, col_sel, count, layout, col_no, heap_ptr);
		break;
	default:
		throw InternalException("Unimplemented type for RowOperations::Gather");
	}
}